

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::splitFacesFromEquirectangular<unsigned_char>
               (uchar *_data,size_t _width,size_t _height,size_t _channels,
               CubemapFace<unsigned_char> **_faces)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  CubemapFace<unsigned_char> *__s;
  uchar *puVar5;
  uchar *puVar6;
  float fVar7;
  uint32_t ySrc;
  uint32_t xSrc;
  float ySrcf;
  float xSrcf;
  float vec [3];
  float vv;
  float uu;
  uchar *dstColumnData;
  uint32_t xx;
  uchar *dstRowData;
  int local_48;
  uint32_t yy;
  int i;
  float invfaceWidthf;
  float srcHeightMinusOne;
  float srcWidthMinusOne;
  uint32_t faceHeight;
  uint32_t faceWidth;
  CubemapFace<unsigned_char> **_faces_local;
  size_t _channels_local;
  size_t _height_local;
  size_t _width_local;
  uchar *_data_local;
  
  uVar4 = _height + 1 >> 1;
  uVar1 = (uint)uVar4;
  _height_local._0_4_ = (int)_width;
  _channels_local._0_4_ = (int)_height;
  fVar7 = 1.0 / (float)(uVar4 & 0xffffffff);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    __s = (CubemapFace<unsigned_char> *)operator_new(0x18);
    memset(__s,0,0x18);
    _faces[local_48] = __s;
    _faces[local_48]->id = local_48;
    puVar5 = (uchar *)operator_new__((ulong)(uVar1 * 3 * uVar1));
    _faces[local_48]->data = puVar5;
    _faces[local_48]->width = uVar1;
    _faces[local_48]->height = uVar1;
    _faces[local_48]->currentOffset = 0;
    for (dstRowData._4_4_ = 0; dstRowData._4_4_ < uVar1; dstRowData._4_4_ = dstRowData._4_4_ + 1) {
      puVar5 = _faces[local_48]->data;
      for (dstColumnData._4_4_ = 0; dstColumnData._4_4_ < uVar1;
          dstColumnData._4_4_ = dstColumnData._4_4_ + 1) {
        puVar6 = puVar5 + (ulong)(dstColumnData._4_4_ * 3) + (ulong)(dstRowData._4_4_ * uVar1 * 3);
        vec[2] = ((float)dstColumnData._4_4_ + (float)dstColumnData._4_4_) * fVar7 + -1.0;
        vec[1] = (float)dstRowData._4_4_ * 2.0 * fVar7 + -1.0;
        texelCoordToVec(&ySrcf,vec[2],vec[1],(uint8_t)local_48);
        latLongFromVec((float *)&xSrc,(float *)&ySrc,&ySrcf);
        xSrc = (uint32_t)((float)((int)_height_local + -1) * (float)xSrc);
        ySrc = (uint32_t)((float)((int)_channels_local + -1) * (float)ySrc);
        uVar2 = ftou((float)xSrc);
        uVar3 = ftou((float)ySrc);
        *puVar6 = _data[uVar3 * _width * _channels + uVar2 * _channels];
        puVar6[1] = _data[uVar3 * _width * _channels + uVar2 * _channels + 1];
        puVar6[2] = _data[uVar3 * _width * _channels + uVar2 * _channels + 2];
      }
    }
  }
  return;
}

Assistant:

void splitFacesFromEquirectangular(const T *_data, size_t _width, size_t _height, size_t _channels, CubemapFace<T> **_faces ) {
    // Alloc data.
    const uint32_t faceWidth = (_height + 1)/2;
    const uint32_t faceHeight = faceWidth;

    // Get source parameters.
    const float srcWidthMinusOne  = float(int(_width-1));
    const float srcHeightMinusOne = float(int(_height-1));
    const float invfaceWidthf = 1.0f/float(faceWidth);

    for (int i = 0; i < 6; i++) {
        _faces[i] = new CubemapFace<T>();
        _faces[i]->id = i;
        _faces[i]->data = new T[3 * faceWidth * faceHeight];
        _faces[i]->width = faceWidth;
        _faces[i]->height = faceHeight;
        _faces[i]->currentOffset = 0;

        for (uint32_t yy = 0; yy < faceHeight; ++yy) {
            T* dstRowData = &_faces[i]->data[yy * faceWidth * 3];

            for (uint32_t xx = 0; xx < faceWidth; ++xx) {
                T* dstColumnData = &dstRowData[xx * 3];

                // Cubemap (u,v) on current face.
                const float uu = 2.0f*xx*invfaceWidthf-1.0f;
                const float vv = 2.0f*yy*invfaceWidthf-1.0f;

                // Get cubemap vector (x,y,z) from (u,v,faceIdx).
                float vec[3];
                texelCoordToVec(vec, uu, vv, i);

                // Convert cubemap vector (x,y,z) to latlong (u,v).
                float xSrcf;
                float ySrcf;
                latLongFromVec(xSrcf, ySrcf, vec);

                // Convert from [0..1] to [0..(size-1)] range.
                xSrcf *= srcWidthMinusOne;
                ySrcf *= srcHeightMinusOne;

                // Sample from latlong (u,v).
                #ifdef USE_BILINEAR_INTERPOLATION
                    const uint32_t x0 = ftou(xSrcf);
                    const uint32_t y0 = ftou(ySrcf);
                    const uint32_t x1 = M_MIN(x0+1, _width-1);
                    const uint32_t y1 = M_MIN(y0+1, _height-1);

                    const T *src0 = &_data[y0 * _width * _channels + x0 * _channels];
                    const T *src1 = &_data[y0 * _width * _channels + x1 * _channels];
                    const T *src2 = &_data[y1 * _width * _channels + x0 * _channels];
                    const T *src3 = &_data[y1 * _width * _channels + x1 * _channels];

                    const float tx = xSrcf - float(int(x0));
                    const float ty = ySrcf - float(int(y0));
                    const float invTx = 1.0f - tx;
                    const float invTy = 1.0f - ty;

                    T p0[3];
                    T p1[3];
                    T p2[3];
                    T p3[3];
                    vec3Mul(p0, src0, invTx*invTy);
                    vec3Mul(p1, src1,    tx*invTy);
                    vec3Mul(p2, src2, invTx*   ty);
                    vec3Mul(p3, src3,    tx*   ty);

                    const T rr = p0[0] + p1[0] + p2[0] + p3[0];
                    const T gg = p0[1] + p1[1] + p2[1] + p3[1];
                    const T bb = p0[2] + p1[2] + p2[2] + p3[2];

                    dstColumnData[0] = rr;
                    dstColumnData[1] = gg;
                    dstColumnData[2] = bb;
                #else
                    const uint32_t xSrc = ftou(xSrcf);
                    const uint32_t ySrc = ftou(ySrcf);

                    dstColumnData[0] = _data[ySrc * _width * _channels + xSrc * _channels + 0];
                    dstColumnData[1] = _data[ySrc * _width * _channels + xSrc * _channels + 1];
                    dstColumnData[2] = _data[ySrc * _width * _channels + xSrc * _channels + 2];
                #endif
            }
        }
    }
}